

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveIn::in<chrono::ChFrame<double>>
          (ChArchiveIn *this,ChNameValue<chrono::ChFrame<double>_> *bVal)

{
  ChFunctorArchiveInSpecific<chrono::ChFrame<double>_> specFuncA;
  undefined **local_28;
  ChFrame<double> *local_20;
  char *local_18;
  undefined1 *local_10;
  char local_8;
  
  local_10 = (undefined1 *)&local_28;
  local_20 = bVal->_value;
  local_28 = &PTR__ChFunctorArchiveIn_0115cf20;
  local_18 = bVal->_name;
  local_8 = bVal->_flags;
  (**(code **)(*(long *)this + 0x60))();
  return;
}

Assistant:

void in     (ChNameValue<T> bVal) {
          ChFunctorArchiveInSpecific<T> specFuncA(&bVal.value());
          this->in(ChNameValue<ChFunctorArchiveIn>(bVal.name(), specFuncA, bVal.flags()));
      }